

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_GameCommand.cpp
# Opt level: O0

void __thiscall RenX::GameCommand::~GameCommand(GameCommand *this)

{
  size_t sVar1;
  bool bVar2;
  reference ppGVar3;
  size_t sVar4;
  Server *this_00;
  string_view trigger;
  const_iterator local_50;
  string_view local_48;
  size_t local_38;
  size_t server_index;
  Server *server;
  __normal_iterator<RenX::GameCommand_**,_std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>_>
  local_20;
  iterator itr;
  Core *core;
  GameCommand *this_local;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_001fa1b0;
  itr._M_current = (GameCommand **)getCore();
  local_20._M_current =
       (GameCommand **)
       std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>::begin
                 (&g_GameMasterCommandList);
  while( true ) {
    server = (Server *)
             std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>::end
                       (&g_GameMasterCommandList);
    bVar2 = __gnu_cxx::
            operator==<RenX::GameCommand_**,_std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>_>
                      (&local_20,
                       (__normal_iterator<RenX::GameCommand_**,_std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>_>
                        *)&server);
    if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0018677e;
    ppGVar3 = __gnu_cxx::
              __normal_iterator<RenX::GameCommand_**,_std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>_>
              ::operator*(&local_20);
    if (*ppGVar3 == this) break;
    __gnu_cxx::
    __normal_iterator<RenX::GameCommand_**,_std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>_>
    ::operator++(&local_20);
  }
  local_38 = 0;
  while( true ) {
    sVar1 = local_38;
    sVar4 = Core::getServerCount((Core *)itr._M_current);
    if (sVar1 == sVar4) break;
    this_00 = Core::getServer((Core *)itr._M_current,local_38);
    server_index = (size_t)this_00;
    if (this_00 != (Server *)0x0) {
      trigger = (string_view)Jupiter::Command::getTrigger((ulong)this);
      local_48 = trigger;
      Server::removeCommand(this_00,trigger);
    }
    local_38 = local_38 + 1;
  }
  __gnu_cxx::
  __normal_iterator<RenX::GameCommand*const*,std::vector<RenX::GameCommand*,std::allocator<RenX::GameCommand*>>>
  ::__normal_iterator<RenX::GameCommand**>
            ((__normal_iterator<RenX::GameCommand*const*,std::vector<RenX::GameCommand*,std::allocator<RenX::GameCommand*>>>
              *)&local_50,&local_20);
  std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>::erase
            (&g_GameMasterCommandList,local_50);
LAB_0018677e:
  Jupiter::Command::~Command(&this->super_Command);
  return;
}

Assistant:

RenX::GameCommand::~GameCommand() {
	RenX::Core *core = RenX::getCore();
	for (auto itr = RenX::GameMasterCommandList.begin(); itr != RenX::GameMasterCommandList.end(); ++itr) {
		if (*itr == this) {
			RenX::Server *server;
			for (size_t server_index = 0; server_index != core->getServerCount(); ++server_index) {
				server = core->getServer(server_index);
				if (server != nullptr) {
					server->removeCommand(this->getTrigger());
				}
			}

			RenX::GameMasterCommandList.erase(itr);
			break;
		}
	}
}